

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
SimpleParallelAnalyzerSettings::UpdateInterfacesFromSettings(SimpleParallelAnalyzerSettings *this)

{
  pointer pCVar1;
  pointer pCVar2;
  ulong uVar3;
  
  pCVar1 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar2 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar3 = 0; ((ulong)((long)pCVar1 - (long)pCVar2) >> 4 & 0xffffffff) != uVar3;
      uVar3 = uVar3 + 1) {
    AnalyzerSettingInterfaceChannel::SetChannel
              ((Channel *)
               (this->mDataChannelsInterface).
               super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3]);
  }
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mClockChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mClockEdge);
  return;
}

Assistant:

void SimpleParallelAnalyzerSettings::UpdateInterfacesFromSettings()
{
	U32 count = (U32)mDataChannels.size();
	for( U32 i=0; i<count; i++ )
	{
		mDataChannelsInterface[i]->SetChannel( mDataChannels[i] );
	}

	mClockChannelInterface->SetChannel( mClockChannel );
	mClockEdgeInterface->SetNumber( mClockEdge );
}